

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder,DtoaMode mode)

{
  bool bVar1;
  int iVar2;
  bool local_65;
  int exponent;
  char local_58 [3];
  bool unique_zero;
  int decimal_rep_length;
  char decimal_rep [18];
  bool local_3d;
  int kDecimalRepCapacity;
  bool sign;
  int decimal_point;
  DtoaMode local_2c;
  StringBuilder *pSStack_28;
  DtoaMode mode_local;
  StringBuilder *result_builder_local;
  double value_local;
  DoubleToStringConverter *this_local;
  
  local_65 = SHORTEST_SINGLE < mode;
  local_2c = mode;
  pSStack_28 = result_builder;
  result_builder_local = (StringBuilder *)value;
  value_local = (double)this;
  if (local_65) {
    __assert_fail("mode == SHORTEST || mode == SHORTEST_SINGLE",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0xa5,
                  "bool FIX::double_conversion::DoubleToStringConverter::ToShortestIeeeNumber(double, StringBuilder *, DoubleToStringConverter::DtoaMode) const"
                 );
  }
  Double::Double((Double *)&stack0xffffffffffffffc8,value);
  bVar1 = Double::IsSpecial((Double *)&stack0xffffffffffffffc8);
  if (bVar1) {
    this_local._7_1_ = HandleSpecialValues(this,(double)result_builder_local,pSStack_28);
  }
  else {
    decimal_rep[0xc] = '\x12';
    decimal_rep[0xd] = '\0';
    decimal_rep[0xe] = '\0';
    decimal_rep[0xf] = '\0';
    DoubleToAscii((double)result_builder_local,local_2c,0,local_58,0x12,&local_3d,&exponent,
                  &kDecimalRepCapacity);
    if (((local_3d & 1U) != 0) &&
       ((((double)result_builder_local != 0.0 || (NAN((double)result_builder_local))) ||
        ((this->flags_ & 8U) == 0)))) {
      StringBuilder::AddCharacter(pSStack_28,'-');
    }
    iVar2 = kDecimalRepCapacity + -1;
    if ((iVar2 < this->decimal_in_shortest_low_) || (this->decimal_in_shortest_high_ <= iVar2)) {
      CreateExponentialRepresentation(this,local_58,exponent,iVar2,pSStack_28);
    }
    else {
      iVar2 = Max<int>(0,exponent - kDecimalRepCapacity);
      CreateDecimalRepresentation(this,local_58,exponent,kDecimalRepCapacity,iVar2,pSStack_28);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DoubleToStringConverter::ToShortestIeeeNumber(
    double value,
    StringBuilder* result_builder,
    DoubleToStringConverter::DtoaMode mode) const {
  ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE);
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  int decimal_point;
  bool sign;
  const int kDecimalRepCapacity = kBase10MaximalLength + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, mode, 0, decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = (flags_ & UNIQUE_ZERO) != 0;
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  if ((decimal_in_shortest_low_ <= exponent) &&
      (exponent < decimal_in_shortest_high_)) {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length,
                                decimal_point,
                                Max(0, decimal_rep_length - decimal_point),
                                result_builder);
  } else {
    CreateExponentialRepresentation(decimal_rep, decimal_rep_length, exponent,
                                    result_builder);
  }
  return true;
}